

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestRequired::ByteSizeLong(TestRequired *this)

{
  uint uVar1;
  int32_t iVar2;
  uint32_t *puVar3;
  size_t sVar4;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestRequired *this_;
  TestRequired *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar3 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 1) != 0) {
    iVar2 = _internal_a(this);
    sStack_58 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
  }
  if ((uVar1 & 2) != 0) {
    iVar2 = _internal_dummy2(this);
    sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
    sStack_58 = sVar4 + sStack_58;
  }
  if ((uVar1 & 4) != 0) {
    iVar2 = _internal_b(this);
    sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
    sStack_58 = sVar4 + sStack_58;
  }
  if ((uVar1 & 0xf8) != 0) {
    if ((uVar1 & 8) != 0) {
      iVar2 = _internal_dummy4(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      iVar2 = _internal_dummy5(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      iVar2 = _internal_dummy6(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      iVar2 = _internal_dummy7(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x80) != 0) {
      iVar2 = _internal_dummy8(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      iVar2 = _internal_dummy9(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x200) != 0) {
      iVar2 = _internal_dummy10(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x400) != 0) {
      iVar2 = _internal_dummy11(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x800) != 0) {
      iVar2 = _internal_dummy12(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x1000) != 0) {
      iVar2 = _internal_dummy13(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x2000) != 0) {
      iVar2 = _internal_dummy14(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x4000) != 0) {
      iVar2 = _internal_dummy15(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 0x8000) != 0) {
      iVar2 = _internal_dummy16(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      iVar2 = _internal_dummy17(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20000) != 0) {
      iVar2 = _internal_dummy18(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40000) != 0) {
      iVar2 = _internal_dummy19(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x80000) != 0) {
      iVar2 = _internal_dummy20(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x100000) != 0) {
      iVar2 = _internal_dummy21(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x200000) != 0) {
      iVar2 = _internal_dummy22(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x400000) != 0) {
      iVar2 = _internal_dummy23(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x800000) != 0) {
      iVar2 = _internal_dummy24(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0xff000000) != 0) {
    if ((uVar1 & 0x1000000) != 0) {
      iVar2 = _internal_dummy25(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x2000000) != 0) {
      iVar2 = _internal_dummy26(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x4000000) != 0) {
      iVar2 = _internal_dummy27(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x8000000) != 0) {
      iVar2 = _internal_dummy28(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10000000) != 0) {
      iVar2 = _internal_dummy29(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20000000) != 0) {
      iVar2 = _internal_dummy30(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40000000) != 0) {
      iVar2 = _internal_dummy31(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
    if ((uVar1 & 0x80000000) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::ForeignMessage>((this->field_0)._impl_.optional_foreign_)
      ;
      sStack_58 = sVar4 + 2 + sStack_58;
    }
  }
  puVar3 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,1);
  uVar1 = *puVar3;
  if ((uVar1 & 1) != 0) {
    iVar2 = _internal_dummy32(this);
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
    sStack_58 = sVar4 + 2 + sStack_58;
  }
  if ((uVar1 & 2) != 0) {
    iVar2 = _internal_c(this);
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
    sStack_58 = sVar4 + 2 + sStack_58;
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t TestRequired::ByteSizeLong() const {
  const TestRequired& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestRequired)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // int32 a = 1 [features = {
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_a());
    }
  }
   {
    // int32 dummy2 = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy2());
    }
  }
   {
    // int32 b = 3 [features = {
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_b());
    }
  }
  if ((cached_has_bits & 0x000000f8u) != 0) {
    // int32 dummy4 = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy4());
    }
    // int32 dummy5 = 5;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy5());
    }
    // int32 dummy6 = 6;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy6());
    }
    // int32 dummy7 = 7;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy7());
    }
    // int32 dummy8 = 8;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy8());
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // int32 dummy9 = 9;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy9());
    }
    // int32 dummy10 = 10;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy10());
    }
    // int32 dummy11 = 11;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy11());
    }
    // int32 dummy12 = 12;
    if ((cached_has_bits & 0x00000800u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy12());
    }
    // int32 dummy13 = 13;
    if ((cached_has_bits & 0x00001000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy13());
    }
    // int32 dummy14 = 14;
    if ((cached_has_bits & 0x00002000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy14());
    }
    // int32 dummy15 = 15;
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy15());
    }
    // int32 dummy16 = 16;
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy16());
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    // int32 dummy17 = 17;
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy17());
    }
    // int32 dummy18 = 18;
    if ((cached_has_bits & 0x00020000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy18());
    }
    // int32 dummy19 = 19;
    if ((cached_has_bits & 0x00040000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy19());
    }
    // int32 dummy20 = 20;
    if ((cached_has_bits & 0x00080000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy20());
    }
    // int32 dummy21 = 21;
    if ((cached_has_bits & 0x00100000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy21());
    }
    // int32 dummy22 = 22;
    if ((cached_has_bits & 0x00200000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy22());
    }
    // int32 dummy23 = 23;
    if ((cached_has_bits & 0x00400000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy23());
    }
    // int32 dummy24 = 24;
    if ((cached_has_bits & 0x00800000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy24());
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // int32 dummy25 = 25;
    if ((cached_has_bits & 0x01000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy25());
    }
    // int32 dummy26 = 26;
    if ((cached_has_bits & 0x02000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy26());
    }
    // int32 dummy27 = 27;
    if ((cached_has_bits & 0x04000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy27());
    }
    // int32 dummy28 = 28;
    if ((cached_has_bits & 0x08000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy28());
    }
    // int32 dummy29 = 29;
    if ((cached_has_bits & 0x10000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy29());
    }
    // int32 dummy30 = 30;
    if ((cached_has_bits & 0x20000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy30());
    }
    // int32 dummy31 = 31;
    if ((cached_has_bits & 0x40000000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy31());
    }
    // .proto2_unittest.ForeignMessage optional_foreign = 34;
    if ((cached_has_bits & 0x80000000u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_foreign_);
    }
  }
   {
    // int32 dummy32 = 32;
    cached_has_bits = this_._impl_._has_bits_[1];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_dummy32());
    }
  }
   {
    // int32 c = 33 [features = {
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_c());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}